

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDPValueIteration.cpp
# Opt level: O2

void __thiscall MDPValueIteration::PlanSlow(MDPValueIteration *this)

{
  TimedAlgorithm *this_00;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  PlanningUnitDecPOMDPDiscrete *this_01;
  size_t sVar5;
  DecPOMDPDiscreteInterface *pDVar6;
  pointer pQVar7;
  MultiAgentDecisionProcessDiscreteInterface *pMVar8;
  undefined1 auVar9 [16];
  size_t S;
  ulong A;
  ulong uVar10;
  ulong uVar11;
  compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  *pcVar12;
  size_type *psVar13;
  const_reference pdVar14;
  uint uVar15;
  uint uVar16;
  ulong uVar17;
  uint uVar18;
  ulong uVar19;
  bool bVar20;
  undefined1 auVar21 [16];
  double dVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 extraout_var [56];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [64];
  double local_180;
  ulong local_170;
  ulong local_168;
  CMatrix *Ta;
  const_iterator1 local_148;
  const_iterator2 ci;
  vector<boost::numeric::ublas::compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<boost::numeric::ublas::compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
  T;
  QTable oldQtable;
  QTable immReward;
  double p;
  const_iterator2 local_60;
  
  if (this->_m_initialized == false) {
    Initialize(this);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&immReward,"Plan",(allocator<char> *)&oldQtable);
  this_00 = &this->super_TimedAlgorithm;
  TimedAlgorithm::StartTimer(this_00,(string *)&immReward);
  std::__cxx11::string::~string((string *)&immReward);
  this_01 = (this->super_MDPSolver)._m_pu;
  sVar5 = (this_01->super_PlanningUnitMADPDiscrete).super_PlanningUnit._m_horizon;
  S = PlanningUnitMADPDiscrete::GetNrStates(&this_01->super_PlanningUnitMADPDiscrete);
  A = (**(code **)((long)*(((this->super_MDPSolver)._m_pu)->super_PlanningUnitMADPDiscrete)._m_madp
                  + 0x68))();
  QTable::QTable(&immReward,S,A);
  for (uVar16 = 0; uVar11 = (ulong)uVar16, uVar11 < S; uVar16 = uVar16 + 1) {
    for (uVar19 = 0; uVar19 < A; uVar19 = (ulong)((int)uVar19 + 1)) {
      pDVar6 = ((this->super_MDPSolver)._m_pu)->_m_DecPOMDP;
      dVar22 = (double)(**(code **)(*(long *)pDVar6 + 0xc0))(pDVar6,uVar11,uVar19);
      immReward.super_matrix_t.data_.data_[immReward.super_matrix_t.size2_ * uVar11 + uVar19] =
           dVar22;
    }
  }
  if (this->_m_finiteHorizon == false) {
    pDVar6 = ((this->super_MDPSolver)._m_pu)->_m_DecPOMDP;
    uVar19 = (**(code **)(*(long *)((long)&pDVar6->field_0x0 + *(long *)(*(long *)pDVar6 + -0xb0)) +
                         0x70))((long)&pDVar6->field_0x0 + *(long *)(*(long *)pDVar6 + -0xb0));
    uVar11 = 0;
    oldQtable.super_matrix_t.data_.size_ = 0;
    oldQtable.super_matrix_t.data_.data_ = (pointer)0x0;
    oldQtable.super_matrix_t.size1_ = 0;
    oldQtable.super_matrix_t.size2_ = 0;
    oldQtable.super_QTableInterface._vptr_QTableInterface = (_func_int **)&PTR_Get_00604bb0;
    T.
    super__Vector_base<boost::numeric::ublas::compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<boost::numeric::ublas::compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    T.
    super__Vector_base<boost::numeric::ublas::compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<boost::numeric::ublas::compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    T.
    super__Vector_base<boost::numeric::ublas::compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<boost::numeric::ublas::compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    while( true ) {
      if (A == uVar11) break;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_148,"CacheTransitionModel",(allocator<char> *)&ci);
      TimedAlgorithm::StartTimer(this_00,(string *)&local_148);
      std::__cxx11::string::~string((string *)&local_148);
      pcVar12 = (compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                 *)operator_new(0x70);
      boost::numeric::ublas::
      compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
      ::compressed_matrix(pcVar12,S,S,0);
      Ta = pcVar12;
      for (uVar16 = 0; uVar17 = (ulong)uVar16, S != uVar17; uVar16 = uVar16 + 1) {
        for (uVar18 = 0; S != uVar18; uVar18 = uVar18 + 1) {
          pMVar8 = (((this->super_MDPSolver)._m_pu)->super_PlanningUnitMADPDiscrete)._m_madp;
          p = (double)(**(code **)((long)*pMVar8 + 0x108))(pMVar8,uVar17,uVar11);
          if (0.0 < p) {
            local_148.
            super_container_const_reference<boost::numeric::ublas::compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
            .c_ = Ta;
            local_148._8_8_ = uVar17;
            local_148.i_ = (ulong)uVar18;
            boost::numeric::ublas::
            sparse_matrix_element<boost::numeric::ublas::compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
            ::set((sparse_matrix_element<boost::numeric::ublas::compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
                   *)&local_148,&p);
          }
        }
      }
      std::
      vector<boost::numeric::ublas::compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<boost::numeric::ublas::compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
      ::push_back(&T,&Ta);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_148,"CacheTransitionModel",(allocator<char> *)&ci);
      TimedAlgorithm::StopTimer(this_00,(string *)&local_148);
      std::__cxx11::string::~string((string *)&local_148);
      uVar11 = (ulong)((int)uVar11 + 1);
    }
    local_180 = 1.79769313486232e+308;
    while (0.0001 < local_180) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_148,"Iteration",(allocator<char> *)&ci);
      TimedAlgorithm::StartTimer(this_00,(string *)&local_148);
      std::__cxx11::string::~string((string *)&local_148);
      boost::numeric::ublas::
      matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
      ::operator=(&oldQtable.super_matrix_t,
                  &((this->_m_QValues).super__Vector_base<QTable,_std::allocator<QTable>_>._M_impl.
                    super__Vector_impl_data._M_start)->super_matrix_t);
      local_180 = 0.0;
      for (uVar16 = 0; uVar11 = (ulong)uVar16, uVar11 < A; uVar16 = uVar16 + 1) {
        boost::numeric::ublas::
        compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
        ::begin1((iterator1 *)&ci,
                 T.
                 super__Vector_base<boost::numeric::ublas::compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<boost::numeric::ublas::compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar11]);
        local_148.
        super_container_const_reference<boost::numeric::ublas::compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
        .c_ = ci.
              super_container_const_reference<boost::numeric::ublas::compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
              .c_;
        local_148.rank_ = ci.rank_;
        local_148.i_ = ci.i_;
        local_148.j_ = ci.j_;
        local_148.itv_ = ci.itv_;
        local_148.it_ = ci.it_;
        while( true ) {
          boost::numeric::ublas::
          compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
          ::end1((iterator1 *)&local_60,
                 T.
                 super__Vector_base<boost::numeric::ublas::compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<boost::numeric::ublas::compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar11]);
          ci.
          super_container_const_reference<boost::numeric::ublas::compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
          .c_ = local_60.
                super_container_const_reference<boost::numeric::ublas::compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
                .c_;
          ci.rank_ = local_60.rank_;
          ci.i_ = local_60.i_;
          ci.j_ = local_60.j_;
          ci.itv_ = local_60.itv_;
          ci.it_ = local_60.it_;
          bVar20 = boost::numeric::ublas::
                   bidirectional_iterator_base<boost::numeric::ublas::sparse_bidirectional_iterator_tag,_boost::numeric::ublas::compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>::const_iterator1,_double>
                   ::operator!=((bidirectional_iterator_base<boost::numeric::ublas::sparse_bidirectional_iterator_tag,_boost::numeric::ublas::compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>::const_iterator1,_double>
                                 *)&local_148,(derived_iterator_type *)&ci);
          if (!bVar20) break;
          if (local_148.rank_ == 1) {
            uVar18 = (uint)((long)local_148.itv_ -
                            (long)((local_148.
                                    super_container_const_reference<boost::numeric::ublas::compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
                                   .c_)->index1_data_).data_ >> 3);
          }
          else {
            uVar18 = (uint)local_148.i_;
          }
          uVar17 = (ulong)uVar18;
          dVar22 = immReward.super_matrix_t.data_.data_
                   [immReward.super_matrix_t.size2_ * uVar17 + uVar11];
          boost::numeric::ublas::
          compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
          ::const_iterator1::begin(&ci,&local_148);
          local_170 = 0;
          while( true ) {
            boost::numeric::ublas::
            compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
            ::const_iterator1::end(&local_60,&local_148);
            bVar20 = boost::numeric::ublas::
                     bidirectional_iterator_base<boost::numeric::ublas::sparse_bidirectional_iterator_tag,_boost::numeric::ublas::compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>::const_iterator2,_double>
                     ::operator!=((bidirectional_iterator_base<boost::numeric::ublas::sparse_bidirectional_iterator_tag,_boost::numeric::ublas::compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>::const_iterator2,_double>
                                   *)&ci,&local_60);
            if (!bVar20) break;
            psVar13 = &ci.j_;
            if (ci.rank_ == 1) {
              psVar13 = ci.it_;
            }
            local_168 = 0xffefffffffffffff;
            for (uVar18 = 0; uVar18 < A; uVar18 = uVar18 + 1) {
              auVar23._8_8_ = 0;
              auVar23._0_8_ = local_168;
              auVar3._8_8_ = 0;
              auVar3._0_8_ = oldQtable.super_matrix_t.data_.data_
                             [(uint)*psVar13 * oldQtable.super_matrix_t.size2_ + (ulong)uVar18];
              auVar21 = vmaxsd_avx(auVar23,auVar3);
              local_168 = auVar21._0_8_;
            }
            pdVar14 = boost::numeric::ublas::
                      compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                      ::const_iterator2::operator*(&ci);
            auVar24._8_8_ = 0;
            auVar24._0_8_ = local_170;
            auVar28._8_8_ = 0;
            auVar28._0_8_ = local_168;
            auVar4._8_8_ = 0;
            auVar4._0_8_ = *pdVar14;
            auVar21 = vfmadd231sd_fma(auVar24,auVar28,auVar4);
            local_170 = auVar21._0_8_;
            if (ci.rank_ == 1) {
              ci.it_ = ci.it_ + 1;
            }
            else {
              ci.j_ = ci.j_ + 1;
            }
          }
          pQVar7 = (this->_m_QValues).super__Vector_base<QTable,_std::allocator<QTable>_>._M_impl.
                   super__Vector_impl_data._M_start;
          auVar25._8_8_ = 0;
          auVar25._0_8_ = dVar22;
          auVar29._8_8_ = 0;
          auVar29._0_8_ = local_170;
          auVar21._8_8_ = 0;
          auVar21._0_8_ = uVar19;
          auVar21 = vfmadd132sd_fma(auVar29,auVar25,auVar21);
          (pQVar7->super_matrix_t).data_.data_[(pQVar7->super_matrix_t).size2_ * uVar17 + uVar11] =
               auVar21._0_8_;
          auVar9._8_8_ = 0x7fffffffffffffff;
          auVar9._0_8_ = 0x7fffffffffffffff;
          auVar26._8_8_ = 0;
          auVar26._0_8_ =
               oldQtable.super_matrix_t.data_.data_
               [uVar17 * oldQtable.super_matrix_t.size2_ + uVar11] - auVar21._0_8_;
          auVar21 = vandpd_avx512vl(auVar26,auVar9);
          auVar30._8_8_ = 0;
          auVar30._0_8_ = local_180;
          auVar21 = vmaxsd_avx(auVar21,auVar30);
          local_180 = auVar21._0_8_;
          boost::numeric::ublas::
          compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
          ::const_iterator1::operator++(&local_148);
        }
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_148,"Iteration",(allocator<char> *)&ci);
      TimedAlgorithm::StopTimer(this_00,(string *)&local_148);
      std::__cxx11::string::~string((string *)&local_148);
    }
    for (uVar16 = 0; A != uVar16; uVar16 = uVar16 + 1) {
      pcVar12 = T.
                super__Vector_base<boost::numeric::ublas::compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<boost::numeric::ublas::compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar16];
      if (pcVar12 !=
          (compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
           *)0x0) {
        boost::numeric::ublas::
        compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
        ::~compressed_matrix(pcVar12);
      }
      operator_delete(pcVar12,0x70);
    }
    std::
    _Vector_base<boost::numeric::ublas::compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<boost::numeric::ublas::compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
    ::~_Vector_base(&T.
                     super__Vector_base<boost::numeric::ublas::compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<boost::numeric::ublas::compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
                   );
    boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>::~unbounded_array
              (&oldQtable.super_matrix_t.data_);
  }
  else {
    uVar19 = sVar5 - 1;
    uVar11 = uVar19;
    do {
      for (uVar16 = 0; uVar17 = (ulong)uVar16, uVar17 < S; uVar16 = uVar16 + 1) {
        for (uVar10 = 0; uVar10 < A; uVar10 = (ulong)((int)uVar10 + 1)) {
          auVar31 = ZEXT864(0) << 0x40;
          auVar27._0_8_ = 0.0;
          dVar22 = immReward.super_matrix_t.data_.data_
                   [immReward.super_matrix_t.size2_ * uVar17 + uVar10];
          if (uVar11 < uVar19) {
            uVar18 = 0;
            while( true ) {
              auVar27._0_8_ = auVar31._0_8_;
              if (S <= uVar18) break;
              auVar21 = ZEXT816(0xffefffffffffffff);
              pQVar7 = (this->_m_QValues).super__Vector_base<QTable,_std::allocator<QTable>_>.
                       _M_impl.super__Vector_impl_data._M_start;
              for (uVar15 = 0; uVar15 < A; uVar15 = uVar15 + 1) {
                auVar1._8_8_ = 0;
                auVar1._0_8_ = pQVar7[uVar11 + 1].super_matrix_t.data_.data_
                               [pQVar7[uVar11 + 1].super_matrix_t.size2_ * (ulong)uVar18 +
                                (ulong)uVar15];
                auVar21 = vmaxsd_avx(auVar21,auVar1);
              }
              pMVar8 = (((this->super_MDPSolver)._m_pu)->super_PlanningUnitMADPDiscrete)._m_madp;
              auVar31._0_8_ = (**(code **)((long)*pMVar8 + 0x108))(pMVar8,uVar17,uVar10);
              auVar31._8_56_ = extraout_var;
              auVar27._8_8_ = 0;
              uVar18 = uVar18 + 1;
              auVar2._8_8_ = 0;
              auVar2._0_8_ = auVar21._0_8_;
              auVar21 = vfmadd231sd_fma(auVar27,auVar31._0_16_,auVar2);
              auVar31 = ZEXT1664(auVar21);
            }
          }
          pQVar7 = (this->_m_QValues).super__Vector_base<QTable,_std::allocator<QTable>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pQVar7[uVar11].super_matrix_t.data_.data_
          [pQVar7[uVar11].super_matrix_t.size2_ * uVar17 + uVar10] = dVar22 + auVar27._0_8_;
        }
      }
      bVar20 = uVar11 != 0;
      uVar11 = uVar11 - 1;
    } while (bVar20);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&oldQtable,"Plan",(allocator<char> *)&local_148);
  TimedAlgorithm::StopTimer(this_00,(string *)&oldQtable);
  std::__cxx11::string::~string((string *)&oldQtable);
  boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>::~unbounded_array
            (&immReward.super_matrix_t.data_);
  return;
}

Assistant:

void MDPValueIteration::PlanSlow()
{
    if(!_m_initialized)
        Initialize();

    StartTimer("Plan");

    size_t horizon = GetPU()->GetHorizon();
    size_t nrS = GetPU()->GetNrStates();
    size_t nrJA =  GetPU()->GetNrJointActions();

    double R_i,R_f,maxQsuc;

    // cache immediate reward for speed
    QTable immReward(nrS,nrJA);
    for(Index sI = 0; sI < nrS; sI++)
        for(Index jaI = 0; jaI < nrJA; jaI++)
            immReward(sI,jaI)=GetPU()->GetReward(sI, jaI);

   
    if(_m_finiteHorizon)
    {
        for(size_t t = horizon - 1; true; t--)
        {
            for(Index sI = 0; sI < nrS; sI++)
            {
                for(Index jaI = 0; jaI < nrJA; jaI++)
                {
                    //calc. expected immediate reward
                    R_i = immReward(sI,jaI);
                    R_f = 0.0;
                    if(t < horizon - 1)
                    {
                        //calc. expected future reward
                        for(Index ssucI = 0; ssucI < nrS; ssucI++)
                        {
                            //find the best action at ssucI
                            maxQsuc = -DBL_MAX;
                            for(Index jasucI = 0; jasucI < nrJA; jasucI++)
                                maxQsuc = max( _m_QValues[t+1](ssucI,jasucI),
                                               maxQsuc);
                            
                            R_f += GetPU()->GetTransitionProbability(sI, jaI,
                                                                     ssucI)
                                * maxQsuc;
                        }//done calc. expected future reward
                    }
                    _m_QValues[t](sI,jaI) = R_i + R_f;
                }//end for jaI
            }//end for sI
            if(t == 0) //escape from (loop t is unsigned!)
                break;
        }
    }
    else // infinite horizon problem
    {
        double maxDelta=DBL_MAX;
        double gamma=GetPU()->GetDiscount();
        QTable oldQtable;

        // in infinite-horizon case, it is typically worth to cache
        // the transition model
        typedef boost::numeric::ublas::compressed_matrix<double> CMatrix;
        vector<CMatrix*> T;
        CMatrix *Ta;
        double p;
        for(unsigned int a=0;a!=nrJA;++a)
        {
#if DEBUG_MDPValueIteration
            PrintTimersSummary();
#endif
            StartTimer("CacheTransitionModel");
            Ta=new CMatrix(nrS,nrS);

            for(unsigned int s=0;s!=nrS;++s)
                for(unsigned int s1=0;s1!=nrS;++s1)
                {
                    p=GetPU()->GetTransitionProbability(s,a,s1);
                    if(p>0)
                        (*Ta)(s,s1)=p;
                }

            T.push_back(Ta);
            StopTimer("CacheTransitionModel");
        }

        Index sI,ssucI;
        while(maxDelta>1e-4)
        {
            StartTimer("Iteration");
            maxDelta=0;
            oldQtable=_m_QValues[0];
            for(Index jaI = 0; jaI < nrJA; jaI++)
            {
                for(CMatrix::const_iterator1 ri=T[jaI]->begin1();
                    ri!=T[jaI]->end1(); ++ri)
                {
                    sI=ri.index1();

                    //calc. expected immediate reward
                    R_i = immReward(sI,jaI);
                    R_f = 0.0;
                    //calc. expected future reward
                    
                    for (CMatrix::const_iterator2 ci = ri.begin();
                         ci != ri.end(); ++ci)
                    {
                        ssucI=ci.index2();

                        //find the best action at ssucI
                        maxQsuc = -DBL_MAX;
                        for(Index jasucI = 0; jasucI < nrJA; jasucI++)
                            maxQsuc = max( oldQtable(ssucI,jasucI),
                                           maxQsuc);
                            
                        R_f += *ci * maxQsuc;
                    }//done calc. expected future reward

                    _m_QValues[0](sI,jaI) = R_i + gamma*R_f;
                    maxDelta=max(maxDelta,abs(oldQtable(sI,jaI)-
                                              _m_QValues[0](sI,jaI)));
                }//end for jaI
            }//end for sI

            StopTimer("Iteration");

#if DEBUG_MDPValueIteration
            cout << "delta " << maxDelta << endl;
            PrintTimersSummary();
#endif
        }

        for(unsigned int a=0;a!=nrJA;++a)
            delete T[a];
    }

    StopTimer("Plan");

#if DEBUG_MDPValueIteration
    PrintTimersSummary();
#endif
}